

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

int classify_keyword(char *start,char *end,int flags)

{
  int iVar1;
  char *b;
  ulong uVar2;
  size_t sStack_30;
  
  uVar2 = (long)end - (long)start;
  if (uVar2 == 2) {
    iVar1 = my_memcasecmp(start,"rc",2);
    if (iVar1 == 0) {
      return 1;
    }
    iVar1 = my_memcasecmp(start,"pl",2);
    if (iVar1 == 0) {
      return 2;
    }
    goto LAB_0010146d;
  }
  if (uVar2 == 4) {
    b = "beta";
    sStack_30 = 4;
LAB_001013ae:
    iVar1 = my_memcasecmp(start,b,sStack_30);
    if (iVar1 == 0) {
      return 1;
    }
  }
  else {
    if (uVar2 == 5) {
      b = "alpha";
      sStack_30 = 5;
      goto LAB_001013ae;
    }
    if ((long)uVar2 < 3) goto LAB_0010146d;
  }
  iVar1 = my_memcasecmp(start,"pre",3);
  if (iVar1 == 0) {
    return 1;
  }
  if (3 < uVar2) {
    iVar1 = my_memcasecmp(start,"post",4);
    if (iVar1 == 0) {
      return 2;
    }
    if (uVar2 != 4) {
      iVar1 = my_memcasecmp(start,"patch",5);
      if (iVar1 == 0) {
        return 2;
      }
      if ((uVar2 == 6) && (iVar1 = my_memcasecmp(start,"errata",6), iVar1 == 0)) {
        return 2;
      }
    }
  }
LAB_0010146d:
  iVar1 = 0;
  if (uVar2 == 1 && (flags & 1U) != 0) {
    iVar1 = (uint)((*start + 0xb0U & 0xdf) == 0) * 2;
  }
  return iVar1;
}

Assistant:

static int classify_keyword(const char* start, const char* end, int flags) {
	if (end - start == 5 && my_memcasecmp(start, "alpha", 5) == 0)
		return KEYWORD_PRE_RELEASE;
	else if (end - start == 4 && my_memcasecmp(start, "beta", 4) == 0)
		return KEYWORD_PRE_RELEASE;
	else if (end - start == 2 && my_memcasecmp(start, "rc", 2) == 0)
		return KEYWORD_PRE_RELEASE;
	else if (end - start >= 3 && my_memcasecmp(start, "pre", 3) == 0)
		return KEYWORD_PRE_RELEASE;
	else if (end - start >= 4 && my_memcasecmp(start, "post", 4) == 0)
		return KEYWORD_POST_RELEASE;
	else if (end - start >= 5 && my_memcasecmp(start, "patch", 5) == 0)
		return KEYWORD_POST_RELEASE;
	else if (end - start == 2 && my_memcasecmp(start, "pl", 2) == 0)  /* patchlevel */
		return KEYWORD_POST_RELEASE;
	else if (end - start == 6 && my_memcasecmp(start, "errata", 6) == 0)
		return KEYWORD_POST_RELEASE;
	else if (flags & VERSIONFLAG_P_IS_PATCH && end - start == 1 && (*start == 'p' || *start == 'P'))
		return KEYWORD_POST_RELEASE;

	return KEYWORD_UNKNOWN;
}